

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadEffectProfileCommon(ColladaParser *this,Effect *pEffect)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  mapped_type *pmVar7;
  undefined4 extraout_var_11;
  mapped_type *pmVar8;
  undefined4 extraout_var_12;
  Sampler *pSampler;
  aiColor4D *pColor;
  ai_real *pFloat;
  char *pcVar9;
  aiColor4D dummy;
  string id;
  undefined1 local_148 [8];
  long *plStack_140;
  long local_138;
  long lStack_130;
  pointer local_128;
  pointer puStack_120;
  pointer local_118;
  long *plStack_110;
  undefined8 local_108;
  long alStack_100 [3];
  key_type local_e8;
  ImageLibrary *local_c8;
  ParamLibrary *local_c0;
  Sampler *local_b8;
  ai_real *local_b0;
  ai_real *local_a8;
  ai_real *local_a0;
  ai_real *local_98;
  Sampler *local_90;
  aiColor4D *local_88;
  Sampler *local_80;
  aiColor4D *local_78;
  Sampler *local_70;
  aiColor4D *local_68;
  Sampler *local_60;
  aiColor4D *local_58;
  Sampler *local_50;
  aiColor4D *local_48;
  Sampler *local_40;
  aiColor4D *local_38;
  
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar4 != '\0') {
    local_b8 = &pEffect->mTexBump;
    local_b0 = &pEffect->mRefractIndex;
    local_a8 = &pEffect->mTransparency;
    local_a0 = &pEffect->mReflectivity;
    local_98 = &pEffect->mShininess;
    local_88 = &pEffect->mTransparent;
    local_90 = &pEffect->mTexTransparent;
    local_78 = &pEffect->mReflective;
    local_80 = &pEffect->mTexReflective;
    local_68 = &pEffect->mSpecular;
    local_70 = &pEffect->mTexSpecular;
    local_58 = &pEffect->mDiffuse;
    local_60 = &pEffect->mTexDiffuse;
    local_48 = &pEffect->mAmbient;
    local_50 = &pEffect->mTexAmbient;
    local_38 = &pEffect->mEmissive;
    local_40 = &pEffect->mTexEmissive;
    local_c8 = &this->mImageLibrary;
    local_c0 = &pEffect->mParams;
    do {
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar4 == 1) {
        if (iVar5 != 1) goto LAB_004267ce;
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar4 = strcmp((char *)CONCAT44(extraout_var,iVar4),"newparam");
        if (iVar4 == 0) {
          uVar6 = GetAttribute(this,"sid");
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar6);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,(char *)CONCAT44(extraout_var_10,iVar4),
                     (allocator<char> *)local_148);
          local_148 = (undefined1  [8])0x0;
          local_138 = 0;
          local_128 = (pointer)0x0;
          lStack_130 = 0;
          plStack_140 = &lStack_130;
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>_>
                   ::operator[](local_c0,&local_e8);
          pmVar7->mType = local_148._0_4_;
          std::__cxx11::string::operator=((string *)&pmVar7->mReference,(string *)&plStack_140);
          if (plStack_140 != &lStack_130) {
            operator_delete(plStack_140,lStack_130 + 1);
          }
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>_>
                   ::operator[](local_c0,&local_e8);
          ReadEffectParam(this,pmVar7);
LAB_004263ae:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar4 != 1) goto LAB_004267ce;
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar4 = strcmp((char *)CONCAT44(extraout_var_00,iVar4),"technique");
          if (iVar4 != 0) {
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar4 != 1) goto LAB_004267ce;
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar4 = strcmp((char *)CONCAT44(extraout_var_01,iVar4),"extra");
            if (iVar4 != 0) {
              if (this->mFormat == FV_1_4_n) {
                iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                if (iVar4 != 1) goto LAB_004267ce;
                iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar4 = strcmp((char *)CONCAT44(extraout_var_02,iVar4),"image");
                if (iVar4 == 0) {
                  uVar6 = GetAttribute(this,"id");
                  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar6);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_e8,(char *)CONCAT44(extraout_var_11,iVar4),
                             (allocator<char> *)local_148);
                  local_148 = (undefined1  [8])&local_138;
                  alStack_100[1] = 0;
                  local_108 = 0;
                  local_138 = 0;
                  lStack_130 = 0;
                  plStack_140 = (long *)0x0;
                  local_118 = (pointer)0x0;
                  local_128 = (pointer)0x0;
                  puStack_120 = (pointer)0x0;
                  plStack_110 = alStack_100;
                  alStack_100[0] = 0;
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                           ::operator[](local_c8,&local_e8);
                  std::__cxx11::string::operator=((string *)pmVar8,(string *)local_148);
                  puVar1 = (pmVar8->mImageData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  puVar2 = (pmVar8->mImageData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
                  (pmVar8->mImageData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start = local_128;
                  (pmVar8->mImageData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish = puStack_120;
                  (pmVar8->mImageData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = local_118;
                  local_128 = (pointer)0x0;
                  puStack_120 = (pointer)0x0;
                  local_118 = (pointer)0x0;
                  if (puVar1 != (pointer)0x0) {
                    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                  }
                  std::__cxx11::string::operator=
                            ((string *)&pmVar8->mEmbeddedFormat,(string *)&plStack_110);
                  if (plStack_110 != alStack_100) {
                    operator_delete(plStack_110,alStack_100[0] + 1);
                  }
                  if (local_128 != (pointer)0x0) {
                    operator_delete(local_128,(long)local_118 - (long)local_128);
                  }
                  if (local_148 != (undefined1  [8])&local_138) {
                    operator_delete((void *)local_148,local_138 + 1);
                  }
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                           ::operator[](local_c8,&local_e8);
                  ReadImage(this,pmVar8);
                  goto LAB_004263ae;
                }
              }
              iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar4 != 1) {
LAB_004267ce:
                __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                              ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
              }
              iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar4 = strcmp((char *)CONCAT44(extraout_var_03,iVar4),"phong");
              if (iVar4 == 0) {
                pEffect->mShadeType = Shade_Phong;
              }
              else {
                iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                if (iVar4 != 1) goto LAB_004267ce;
                iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar4 = strcmp((char *)CONCAT44(extraout_var_04,iVar4),"constant");
                if (iVar4 == 0) {
                  pEffect->mShadeType = Shade_Constant;
                }
                else {
                  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                  if (iVar4 != 1) goto LAB_004267ce;
                  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar4 = strcmp((char *)CONCAT44(extraout_var_05,iVar4),"lambert");
                  if (iVar4 == 0) {
                    pEffect->mShadeType = Shade_Lambert;
                  }
                  else {
                    iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                    if (iVar4 != 1) goto LAB_004267ce;
                    iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                    iVar4 = strcmp((char *)CONCAT44(extraout_var_06,iVar4),"blinn");
                    if (iVar4 == 0) {
                      pEffect->mShadeType = Shade_Blinn;
                    }
                    else {
                      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                      if (iVar4 != 1) goto LAB_004267ce;
                      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                      iVar4 = strcmp((char *)CONCAT44(extraout_var_07,iVar4),"emission");
                      pSampler = local_40;
                      pColor = local_38;
                      if (iVar4 != 0) {
                        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                        if (iVar4 != 1) goto LAB_004267ce;
                        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                        iVar4 = strcmp((char *)CONCAT44(extraout_var_08,iVar4),"ambient");
                        pSampler = local_50;
                        pColor = local_48;
                        if ((((iVar4 != 0) &&
                             (bVar3 = IsElement(this,"diffuse"), pSampler = local_60,
                             pColor = local_58, !bVar3)) &&
                            (bVar3 = IsElement(this,"specular"), pSampler = local_70,
                            pColor = local_68, !bVar3)) &&
                           (bVar3 = IsElement(this,"reflective"), pSampler = local_80,
                           pColor = local_78, !bVar3)) {
                          bVar3 = IsElement(this,"transparent");
                          if (!bVar3) {
                            bVar3 = IsElement(this,"shininess");
                            pFloat = local_98;
                            if (((bVar3) ||
                                (bVar3 = IsElement(this,"reflectivity"), pFloat = local_a0, bVar3))
                               || ((bVar3 = IsElement(this,"transparency"), pFloat = local_a8, bVar3
                                   || (bVar3 = IsElement(this,"index_of_refraction"),
                                      pFloat = local_b0, bVar3)))) {
                              ReadEffectFloat(this,pFloat);
                            }
                            else {
                              bVar3 = IsElement(this,"double_sided");
                              if (bVar3) {
                                bVar3 = ReadBoolFromTextContent(this);
                                pEffect->mDoubleSided = bVar3;
                              }
                              else {
                                bVar3 = IsElement(this,"bump");
                                if (bVar3) {
                                  local_148 = (undefined1  [8])0x0;
                                  plStack_140 = (long *)0x0;
                                  pSampler = local_b8;
                                  pColor = (aiColor4D *)local_148;
                                  goto LAB_0042666b;
                                }
                                bVar3 = IsElement(this,"wireframe");
                                if (bVar3) {
                                  bVar3 = ReadBoolFromTextContent(this);
                                  pEffect->mWireframe = bVar3;
                                  pcVar9 = "wireframe";
                                }
                                else {
                                  bVar3 = IsElement(this,"faceted");
                                  if (!bVar3) {
                                    SkipElement(this);
                                    goto LAB_00426670;
                                  }
                                  bVar3 = ReadBoolFromTextContent(this);
                                  pEffect->mFaceted = bVar3;
                                  pcVar9 = "faceted";
                                }
                                TestClosing(this,pcVar9);
                              }
                            }
                            goto LAB_00426670;
                          }
                          pEffect->mHasTransparency = true;
                          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[8])(this->mReader,"opaque");
                          pcVar9 = (char *)CONCAT44(extraout_var_12,iVar4);
                          iVar4 = strcmp(pcVar9,"RGB_ZERO");
                          if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"RGB_ONE"), iVar4 == 0)) {
                            pEffect->mRGBTransparency = true;
                          }
                          iVar4 = strcmp(pcVar9,"RGB_ZERO");
                          if ((iVar4 == 0) ||
                             (iVar4 = strcmp(pcVar9,"A_ZERO"), pSampler = local_90,
                             pColor = local_88, iVar4 == 0)) {
                            pEffect->mInvertTransparency = true;
                            pSampler = local_90;
                            pColor = local_88;
                          }
                        }
                      }
LAB_0042666b:
                      ReadEffectColor(this,pColor,pSampler);
                    }
                  }
                }
              }
            }
          }
        }
      }
      else if (iVar5 == 2) {
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar4 = strcmp((char *)CONCAT44(extraout_var_09,iVar4),"profile_COMMON");
        if (iVar4 == 0) {
          return;
        }
      }
LAB_00426670:
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar4 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadEffectProfileCommon(Collada::Effect& pEffect)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("newparam")) {
                // save ID
                int attrSID = GetAttribute("sid");
                std::string sid = mReader->getAttributeValue(attrSID);
                pEffect.mParams[sid] = EffectParam();
                ReadEffectParam(pEffect.mParams[sid]);
            }
            else if (IsElement("technique") || IsElement("extra"))
            {
                // just syntactic sugar
            }

            else if (mFormat == FV_1_4_n && IsElement("image"))
            {
                // read ID. Another entry which is "optional" by design but obligatory in reality
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mImageLibrary[id] = Image();

                // read on from there
                ReadImage(mImageLibrary[id]);
            }

            /* Shading modes */
            else if (IsElement("phong"))
                pEffect.mShadeType = Shade_Phong;
            else if (IsElement("constant"))
                pEffect.mShadeType = Shade_Constant;
            else if (IsElement("lambert"))
                pEffect.mShadeType = Shade_Lambert;
            else if (IsElement("blinn"))
                pEffect.mShadeType = Shade_Blinn;

            /* Color + texture properties */
            else if (IsElement("emission"))
                ReadEffectColor(pEffect.mEmissive, pEffect.mTexEmissive);
            else if (IsElement("ambient"))
                ReadEffectColor(pEffect.mAmbient, pEffect.mTexAmbient);
            else if (IsElement("diffuse"))
                ReadEffectColor(pEffect.mDiffuse, pEffect.mTexDiffuse);
            else if (IsElement("specular"))
                ReadEffectColor(pEffect.mSpecular, pEffect.mTexSpecular);
            else if (IsElement("reflective")) {
                ReadEffectColor(pEffect.mReflective, pEffect.mTexReflective);
            }
            else if (IsElement("transparent")) {
                pEffect.mHasTransparency = true;

                const char* opaque = mReader->getAttributeValueSafe("opaque");

                if (::strcmp(opaque, "RGB_ZERO") == 0 || ::strcmp(opaque, "RGB_ONE") == 0) {
                    pEffect.mRGBTransparency = true;
                }

                // In RGB_ZERO mode, the transparency is interpreted in reverse, go figure...
                if (::strcmp(opaque, "RGB_ZERO") == 0 || ::strcmp(opaque, "A_ZERO") == 0) {
                    pEffect.mInvertTransparency = true;
                }

                ReadEffectColor(pEffect.mTransparent, pEffect.mTexTransparent);
            }
            else if (IsElement("shininess"))
                ReadEffectFloat(pEffect.mShininess);
            else if (IsElement("reflectivity"))
                ReadEffectFloat(pEffect.mReflectivity);

            /* Single scalar properties */
            else if (IsElement("transparency"))
                ReadEffectFloat(pEffect.mTransparency);
            else if (IsElement("index_of_refraction"))
                ReadEffectFloat(pEffect.mRefractIndex);

            // GOOGLEEARTH/OKINO extensions
            // -------------------------------------------------------
            else if (IsElement("double_sided"))
                pEffect.mDoubleSided = ReadBoolFromTextContent();

            // FCOLLADA extensions
            // -------------------------------------------------------
            else if (IsElement("bump")) {
                aiColor4D dummy;
                ReadEffectColor(dummy, pEffect.mTexBump);
            }

            // MAX3D extensions
            // -------------------------------------------------------
            else if (IsElement("wireframe")) {
                pEffect.mWireframe = ReadBoolFromTextContent();
                TestClosing("wireframe");
            }
            else if (IsElement("faceted")) {
                pEffect.mFaceted = ReadBoolFromTextContent();
                TestClosing("faceted");
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "profile_COMMON") == 0)
            {
                break;
            }
        }
    }
}